

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

jsparser_ctx * ctemplate_htmlparser::jsparser_duplicate(jsparser_ctx *src)

{
  undefined8 uVar1;
  int iVar2;
  jsparser_ctx *user;
  
  if (src != (jsparser_ctx *)0x0) {
    user = jsparser_new();
    if (user != (jsparser_ctx *)0x0) {
      iVar2 = src->buffer_end;
      user->buffer_start = src->buffer_start;
      user->buffer_end = iVar2;
      uVar1 = *(undefined8 *)(src->buffer + 8);
      *(undefined8 *)user->buffer = *(undefined8 *)src->buffer;
      *(undefined8 *)(user->buffer + 8) = uVar1;
      *(undefined2 *)(user->buffer + 0x10) = *(undefined2 *)(src->buffer + 0x10);
      statemachine_copy(user->statemachine,src->statemachine,user->statemachine_def,user);
    }
    return user;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,600,"jsparser_ctx *ctemplate_htmlparser::jsparser_duplicate(jsparser_ctx *)");
}

Assistant:

jsparser_ctx *jsparser_duplicate(jsparser_ctx *src)
{
  jsparser_ctx *dst;
  assert(src != NULL);

  dst = jsparser_new();
  if (dst == NULL)
    return NULL;

  jsparser_copy(dst, src);

  return dst;
}